

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  uint bpp_00;
  void *pvVar1;
  void *pvVar2;
  uint in_ECX;
  undefined8 in_RDX;
  long *in_RSI;
  long *in_RDI;
  uint in_R8D;
  long in_R9;
  uchar *unaff_retaddr;
  uchar *padded_1;
  uint i;
  uchar *adam7;
  size_t passstart [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  uint passh [7];
  uint passw [7];
  uchar *padded;
  uint error;
  size_t bpp;
  LodePNGEncoderSettings *in_stack_00000428;
  LodePNGColorMode *in_stack_00000430;
  uint in_stack_00000438;
  uint in_stack_0000043c;
  uchar *in_stack_00000440;
  uchar *in_stack_00000448;
  int local_154;
  undefined8 in_stack_fffffffffffffeb0;
  uint h_00;
  size_t in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffec0;
  uchar *in_stack_fffffffffffffec8;
  uchar *in_stack_fffffffffffffed0;
  long local_110;
  size_t local_108 [8];
  size_t local_c8 [7];
  long local_90;
  uint local_88 [8];
  uint local_68 [10];
  void *local_40;
  uint local_34;
  ulong local_30;
  long local_28;
  uint local_20;
  uint local_1c;
  uint bpp_01;
  
  bpp_01 = (uint)((ulong)in_RDX >> 0x20);
  h_00 = (uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  local_28 = in_R9;
  local_20 = in_R8D;
  local_1c = in_ECX;
  bpp_00 = lodepng_get_bpp((LodePNGColorMode *)0x351c0f);
  local_30 = (ulong)bpp_00;
  local_34 = 0;
  if (*(int *)(local_28 + 8) == 0) {
    *in_RSI = (ulong)local_20 + (ulong)local_20 * (local_1c * local_30 + 7 >> 3);
    pvVar1 = lodepng_malloc(0x351c80);
    *in_RDI = (long)pvVar1;
    if ((*in_RDI == 0) && (*in_RSI != 0)) {
      local_34 = 0x53;
    }
    if (local_34 == 0) {
      if ((local_30 < 8) &&
         (local_1c * local_30 - (local_1c * local_30 + 7 & 0xfffffffffffffff8) != 0)) {
        local_40 = lodepng_malloc(0x351d31);
        if (local_40 == (void *)0x0) {
          local_34 = 0x53;
        }
        if (local_34 == 0) {
          addPaddingBits(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,h_00);
          local_34 = filter(in_stack_00000448,in_stack_00000440,in_stack_0000043c,in_stack_00000438,
                            in_stack_00000430,in_stack_00000428);
        }
        lodepng_free((void *)0x351df8);
      }
      else {
        local_34 = filter(in_stack_00000448,in_stack_00000440,in_stack_0000043c,in_stack_00000438,
                          in_stack_00000430,in_stack_00000428);
      }
    }
  }
  else {
    Adam7_getpassvalues(local_68,local_88,local_c8,local_108,(size_t *)&stack0xfffffffffffffeb8,
                        local_1c,local_20,bpp_00);
    *in_RSI = local_90;
    pvVar1 = lodepng_malloc(0x351eac);
    *in_RDI = (long)pvVar1;
    if (*in_RDI == 0) {
      local_34 = 0x53;
    }
    pvVar1 = lodepng_malloc(0x351edd);
    if ((pvVar1 == (void *)0x0) && (local_110 != 0)) {
      local_34 = 0x53;
    }
    if (local_34 == 0) {
      Adam7_interlace(unaff_retaddr,(uchar *)in_RDI,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,
                      bpp_01);
      for (local_154 = 0; local_154 != 7; local_154 = local_154 + 1) {
        if (local_30 < 8) {
          pvVar2 = lodepng_malloc(0x351f74);
          if (pvVar2 == (void *)0x0) {
            local_34 = 0x53;
            break;
          }
          addPaddingBits(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                         (uint)((ulong)pvVar1 >> 0x20));
          local_34 = filter(in_stack_00000448,in_stack_00000440,in_stack_0000043c,in_stack_00000438,
                            in_stack_00000430,in_stack_00000428);
          lodepng_free((void *)0x352049);
        }
        else {
          local_34 = filter(in_stack_00000448,in_stack_00000440,in_stack_0000043c,in_stack_00000438,
                            in_stack_00000430,in_stack_00000428);
        }
        if (local_34 != 0) break;
      }
    }
    lodepng_free((void *)0x3520d0);
  }
  return local_34;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
                                    unsigned w, unsigned h,
                                    const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings) {
  /*
  This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
  *) if no Adam7: 1) add padding bits (= possible extra bits per scanline if bpp < 8) 2) filter
  *) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
  */
  size_t bpp = lodepng_get_bpp(&info_png->color);
  unsigned error = 0;
  if(info_png->interlace_method == 0) {
    /*image size plus an extra byte per scanline + possible padding bits*/
    *outsize = (size_t)h + ((size_t)h * (((size_t)w * bpp + 7u) / 8u));
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out) && (*outsize)) error = 83; /*alloc fail*/

    if(!error) {
      /*non multiple of 8 bits per scanline, padding bits needed per scanline*/
      if(bpp < 8 && (size_t)w * bpp != (((size_t)w * bpp + 7u) / 8u) * 8u) {
        unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7u) / 8u));
        if(!padded) error = 83; /*alloc fail*/
        if(!error) {
          addPaddingBits(padded, in, (((size_t)w * bpp + 7u) / 8u) * 8u, (size_t)w * bpp, h);
          error = filter(*out, padded, w, h, &info_png->color, settings);
        }
        lodepng_free(padded);
      } else {
        /*we can immediately filter into the out buffer, no other steps needed*/
        error = filter(*out, in, w, h, &info_png->color, settings);
      }
    }
  } else /*interlace_method is 1 (Adam7)*/ {
    unsigned passw[7], passh[7];
    size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned char* adam7;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, (unsigned)bpp);

    *outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out)) error = 83; /*alloc fail*/

    adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
    if(!adam7 && passstart[7]) error = 83; /*alloc fail*/

    if(!error) {
      unsigned i;

      Adam7_interlace(adam7, in, w, h, (unsigned)bpp);
      for(i = 0; i != 7; ++i) {
        if(bpp < 8) {
          unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
          if(!padded) ERROR_BREAK(83); /*alloc fail*/
          addPaddingBits(padded, &adam7[passstart[i]],
                         (((size_t)passw[i] * bpp + 7u) / 8u) * 8u, (size_t)passw[i] * bpp, passh[i]);
          error = filter(&(*out)[filter_passstart[i]], padded,
                         passw[i], passh[i], &info_png->color, settings);
          lodepng_free(padded);
        } else {
          error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
                         passw[i], passh[i], &info_png->color, settings);
        }

        if(error) break;
      }
    }

    lodepng_free(adam7);
  }

  return error;
}